

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_13,_10>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  Vector<float,_4> *pVVar1;
  float *pfVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  bool bVar9;
  undefined4 uVar10;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Type in1;
  Type in0;
  float afStack_118 [6];
  float local_100 [2];
  undefined8 local_f8;
  undefined4 local_f0;
  float local_e8 [4];
  float local_d8 [4];
  float local_c8 [4];
  Matrix<float,_4,_3> local_b8;
  Matrix<float,_4,_4> local_88;
  Matrix<float,_4,_3> local_40;
  long lVar8;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    pfVar2 = (float *)&local_88;
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        uVar10 = 0x3f800000;
        if (lVar3 != lVar6) {
          uVar10 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar6) = uVar10;
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x40);
      lVar5 = lVar5 + 1;
      pfVar2 = pfVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar5 != 4);
    local_88.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_88.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_88.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_88.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_88.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_88.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    local_88.m_data.m_data[3].m_data._0_8_ = *(undefined8 *)evalCtx->in[3].m_data;
    local_88.m_data.m_data[3].m_data._8_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  }
  else {
    pfVar2 = (float *)&local_88;
    local_88.m_data.m_data[3].m_data[0] = 0.0;
    local_88.m_data.m_data[3].m_data[1] = 0.0;
    local_88.m_data.m_data[3].m_data[2] = 0.0;
    local_88.m_data.m_data[3].m_data[3] = 0.0;
    local_88.m_data.m_data[2].m_data[0] = 0.0;
    local_88.m_data.m_data[2].m_data[1] = 0.0;
    local_88.m_data.m_data[2].m_data[2] = 0.0;
    local_88.m_data.m_data[2].m_data[3] = 0.0;
    local_88.m_data.m_data[1].m_data[0] = 0.0;
    local_88.m_data.m_data[1].m_data[1] = 0.0;
    local_88.m_data.m_data[1].m_data[2] = 0.0;
    local_88.m_data.m_data[1].m_data[3] = 0.0;
    local_88.m_data.m_data[0].m_data[0] = 0.0;
    local_88.m_data.m_data[0].m_data[1] = 0.0;
    local_88.m_data.m_data[0].m_data[2] = 0.0;
    local_88.m_data.m_data[0].m_data[3] = 0.0;
    puVar4 = &s_constInMat4x4;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar2[lVar5] = (float)*(undefined4 *)((long)puVar4 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x10);
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 4;
    } while (lVar3 != 4);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    pVVar1 = local_b8.m_data.m_data + 1;
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      auVar7 = _DAT_019f34d0;
      do {
        bVar9 = SUB164(auVar7 ^ _DAT_019ec5b0,4) == -0x80000000 &&
                SUB164(auVar7 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
        if (bVar9) {
          uVar10 = 0x3f800000;
          if (lVar3 != lVar6) {
            uVar10 = 0;
          }
          *(undefined4 *)
           ((long)((Vector<tcu::Vector<float,_4>,_3> *)(pVVar1 + -1))->m_data[0].m_data + lVar6) =
               uVar10;
        }
        if (bVar9) {
          uVar10 = 0x3f800000;
          if (lVar3 + -0x10 != lVar6) {
            uVar10 = 0;
          }
          *(undefined4 *)((long)pVVar1->m_data + lVar6) = uVar10;
        }
        lVar8 = auVar7._8_8_;
        auVar7._0_8_ = auVar7._0_8_ + 2;
        auVar7._8_8_ = lVar8 + 2;
        lVar6 = lVar6 + 0x20;
      } while (lVar6 != 0x40);
      lVar5 = lVar5 + 1;
      lVar3 = lVar3 + 0x10;
      pVVar1 = (Vector<float,_4> *)(pVVar1->m_data + 1);
    } while (lVar5 != 4);
    local_b8.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_b8.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_b8.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_b8.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_b8.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_b8.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  }
  else {
    pfVar2 = (float *)&local_b8;
    local_b8.m_data.m_data[2].m_data[0] = 0.0;
    local_b8.m_data.m_data[2].m_data[1] = 0.0;
    local_b8.m_data.m_data[2].m_data[2] = 0.0;
    local_b8.m_data.m_data[2].m_data[3] = 0.0;
    local_b8.m_data.m_data[1].m_data[0] = 0.0;
    local_b8.m_data.m_data[1].m_data[1] = 0.0;
    local_b8.m_data.m_data[1].m_data[2] = 0.0;
    local_b8.m_data.m_data[1].m_data[3] = 0.0;
    local_b8.m_data.m_data[0].m_data[0] = 0.0;
    local_b8.m_data.m_data[0].m_data[1] = 0.0;
    local_b8.m_data.m_data[0].m_data[2] = 0.0;
    local_b8.m_data.m_data[0].m_data[3] = 0.0;
    puVar4 = &DAT_01beaed0;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        pfVar2[lVar5] = (float)*(undefined4 *)((long)puVar4 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0xc);
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 3;
    } while (lVar3 != 4);
  }
  tcu::operator*(&local_40,&local_88,&local_b8);
  local_c8[0] = local_40.m_data.m_data[0].m_data[0];
  local_c8[1] = local_40.m_data.m_data[0].m_data[1];
  local_c8[2] = local_40.m_data.m_data[0].m_data[2];
  local_d8[0] = local_40.m_data.m_data[1].m_data[1];
  local_d8[1] = local_40.m_data.m_data[1].m_data[2];
  local_d8[2] = local_40.m_data.m_data[1].m_data[3];
  local_100[0] = 0.0;
  local_100[1] = 0.0;
  local_f8 = (ulong)local_f8._4_4_ << 0x20;
  lVar3 = 0;
  do {
    local_100[lVar3] = local_c8[lVar3] + local_d8[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_e8[0] = local_40.m_data.m_data[2].m_data[2];
  local_e8[1] = local_40.m_data.m_data[2].m_data[3];
  local_e8[2] = local_40.m_data.m_data[2].m_data[0];
  afStack_118[2] = 0.0;
  afStack_118[3] = 0.0;
  afStack_118[4] = 0.0;
  lVar3 = 0;
  do {
    afStack_118[lVar3 + 2] = local_100[lVar3] + local_e8[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_f8 = 0x100000000;
  local_f0 = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)local_100[lVar3]] = afStack_118[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}